

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O2

string * __thiscall
Imf_2_5::MultiViewChannelName::getSuffix_abi_cxx11_
          (string *__return_storage_ptr__,MultiViewChannelName *this)

{
  long lVar1;
  string *psVar2;
  
  psVar2 = &this->name;
  lVar1 = std::__cxx11::string::rfind((char)psVar2,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getSuffix() const
  {
        std::size_t q=name.rfind('.');
	if(  q==name.npos  )
	{
	    return name;
	}
	return name.substr(q+1);
      
  }